

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qkeysequenceedit.cpp
# Opt level: O0

void QKeySequenceEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QObject QVar2;
  qsizetype qVar3;
  QKeySequenceEdit *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QKeySequenceEdit *_t;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QKeySequence *in_stack_ffffffffffffff70;
  QKeySequenceEdit *in_stack_ffffffffffffff78;
  QKeySequenceEdit *in_stack_ffffffffffffff80;
  QKeySequence *in_stack_ffffffffffffff88;
  QKeySequenceEdit *in_stack_ffffffffffffff90;
  QKeySequence local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff80 = (QKeySequenceEdit *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff80) {
    case (QKeySequenceEdit *)0x0:
      editingFinished((QKeySequenceEdit *)0x5a7d12);
      break;
    case (QKeySequenceEdit *)0x1:
      keySequenceChanged((QKeySequenceEdit *)in_stack_ffffffffffffff70,
                         (QKeySequence *)
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      break;
    case (QKeySequenceEdit *)0x2:
      setKeySequence(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      break;
    case (QKeySequenceEdit *)0x3:
      clear((QKeySequenceEdit *)in_stack_ffffffffffffff70);
      break;
    case (QKeySequenceEdit *)0x4:
      setMaximumSequenceLength(in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    }
  }
  if ((in_ESI != 5) ||
     ((bVar1 = QtMocHelpers::indexOfMethod<void(QKeySequenceEdit::*)()>
                         (in_RCX,(void **)editingFinished,0,0), !bVar1 &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QKeySequenceEdit::*)(QKeySequence_const&)>
                         (in_RCX,(void **)keySequenceChanged,0,1), !bVar1)))) {
    if (in_ESI == 1) {
      in_stack_ffffffffffffff90 = *(QKeySequenceEdit **)in_RCX;
      in_stack_ffffffffffffff78 = (QKeySequenceEdit *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff78) {
      case (QKeySequenceEdit *)0x0:
        keySequence(in_stack_ffffffffffffff78);
        QKeySequence::operator=
                  (in_stack_ffffffffffffff70,
                   (QKeySequence *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        QKeySequence::~QKeySequence(local_10);
        break;
      case (QKeySequenceEdit *)0x1:
        QVar2 = (QObject)isClearButtonEnabled((QKeySequenceEdit *)in_stack_ffffffffffffff70);
        (in_stack_ffffffffffffff90->super_QWidget).super_QObject = QVar2;
        break;
      case (QKeySequenceEdit *)0x2:
        qVar3 = maximumSequenceLength((QKeySequenceEdit *)in_stack_ffffffffffffff70);
        *(qsizetype *)&in_stack_ffffffffffffff90->super_QWidget = qVar3;
        break;
      case (QKeySequenceEdit *)0x3:
        finishingKeyCombinations(in_stack_ffffffffffffff78);
        QList<QKeyCombination>::operator=
                  ((QList<QKeyCombination> *)in_stack_ffffffffffffff70,
                   (QList<QKeyCombination> *)
                   CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        QList<QKeyCombination>::~QList((QList<QKeyCombination> *)0x5a7ea9);
      }
    }
    if (in_ESI == 2) {
      this = (QKeySequenceEdit *)(ulong)in_EDX;
      switch(this) {
      case (QKeySequenceEdit *)0x0:
        setKeySequence(in_stack_ffffffffffffff90,*(QKeySequence **)in_RCX);
        break;
      case (QKeySequenceEdit *)0x1:
        setClearButtonEnabled(this,(bool)in_stack_ffffffffffffff6f);
        break;
      case (QKeySequenceEdit *)0x2:
        setMaximumSequenceLength(in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
        break;
      case (QKeySequenceEdit *)0x3:
        setFinishingKeyCombinations
                  (this,(QList<QKeyCombination> *)
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKeySequenceEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QKeySequenceEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editingFinished(); break;
        case 1: _t->keySequenceChanged((*reinterpret_cast< std::add_pointer_t<QKeySequence>>(_a[1]))); break;
        case 2: _t->setKeySequence((*reinterpret_cast< std::add_pointer_t<QKeySequence>>(_a[1]))); break;
        case 3: _t->clear(); break;
        case 4: _t->setMaximumSequenceLength((*reinterpret_cast< std::add_pointer_t<qsizetype>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QKeySequenceEdit::*)()>(_a, &QKeySequenceEdit::editingFinished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QKeySequenceEdit::*)(const QKeySequence & )>(_a, &QKeySequenceEdit::keySequenceChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QKeySequence*>(_v) = _t->keySequence(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isClearButtonEnabled(); break;
        case 2: *reinterpret_cast<qsizetype*>(_v) = _t->maximumSequenceLength(); break;
        case 3: *reinterpret_cast<QList<QKeyCombination>*>(_v) = _t->finishingKeyCombinations(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setKeySequence(*reinterpret_cast<QKeySequence*>(_v)); break;
        case 1: _t->setClearButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setMaximumSequenceLength(*reinterpret_cast<qsizetype*>(_v)); break;
        case 3: _t->setFinishingKeyCombinations(*reinterpret_cast<QList<QKeyCombination>*>(_v)); break;
        default: break;
        }
    }
}